

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gb.c
# Opt level: O1

void gb_sound_w_internal(gb_sound_t *gb,UINT8 offset,UINT8 data)

{
  byte *pbVar1;
  UINT8 UVar2;
  _Bool _Var3;
  byte bVar4;
  byte bVar5;
  ushort uVar6;
  byte bVar7;
  ushort uVar8;
  ulong uVar9;
  byte bVar10;
  undefined7 in_register_00000031;
  int iVar11;
  bool bVar12;
  
  uVar9 = CONCAT71(in_register_00000031,offset) & 0xffffffff;
  bVar10 = gb->snd_regs[uVar9];
  UVar2 = (gb->snd_control).on;
  if (UVar2 != '\0') {
    gb->snd_regs[uVar9] = data;
  }
  switch(offset) {
  case '\0':
    (gb->snd_1).reg[0] = data;
    (gb->snd_1).sweep_shift = data & 7;
    (gb->snd_1).sweep_direction = -(data >> 3 & 1) | 1;
    (gb->snd_1).sweep_time = data >> 4 & 7;
    if ((data >> 3 & 1) != 0) {
      return;
    }
    if ((bVar10 & 8) == 0) {
      return;
    }
    if ((gb->snd_1).sweep_neg_mode_used != true) {
      return;
    }
    goto LAB_0015a28e;
  case '\x01':
    (gb->snd_1).reg[1] = data;
    if (UVar2 != '\0') {
      (gb->snd_1).duty = data >> 6;
    }
    (gb->snd_1).length = data & 0x3f;
    (gb->snd_1).length_counting = true;
    break;
  case '\x02':
    (gb->snd_1).reg[2] = data;
    (gb->snd_1).envelope_value = data >> 4;
    (gb->snd_1).envelope_direction = -((data & 8) == 0) | 1;
    (gb->snd_1).envelope_time = data & 7;
    if ((gb->snd_1).channel == '\x03') {
      bVar10 = (gb->snd_1).reg[0] & 0x80;
    }
    else {
      bVar10 = data & 0xf8;
    }
    if (bVar10 != 0) {
      return;
    }
LAB_0015a28e:
    (gb->snd_1).on = false;
    break;
  case '\x03':
    (gb->snd_1).reg[3] = data;
    if ((gb->snd_1).sweep_enabled != false) {
      return;
    }
    uVar6 = ((gb->snd_1).reg[4] & 7) << 8;
    uVar8 = (ushort)data;
    goto LAB_0015a0c0;
  case '\x04':
    (gb->snd_1).reg[4] = data;
    bVar4 = data >> 6;
    bVar10 = gb->snd_regs[4];
    bVar7 = (gb->snd_1).reg[3];
    _Var3 = (gb->snd_1).length_enabled;
    (gb->snd_1).length_enabled = (_Bool)(bVar4 & 1);
    (gb->snd_1).frequency = (bVar10 & 7) << 8 | (ushort)bVar7;
    if (((_Var3 == false) && (((gb->snd_control).cycles & 0x2000) == 0)) &&
       (((gb->snd_1).length_counting == true &&
        (((bVar12 = (bVar4 & 1) != 0, bVar12 && (bVar12)) &&
         (bVar10 = (gb->snd_1).length + 1 & (gb->snd_1).length_mask, (gb->snd_1).length = bVar10,
         bVar10 == 0)))))) {
      (gb->snd_1).on = false;
      (gb->snd_1).length_counting = false;
    }
    uVar8 = (ushort)bVar7;
    if ((char)data < '\0') {
      (gb->snd_1).on = true;
      (gb->snd_1).envelope_enabled = true;
      bVar10 = (gb->snd_1).reg[2];
      (gb->snd_1).envelope_value = bVar10 >> 4;
      (gb->snd_1).envelope_count = (gb->snd_1).envelope_time;
      UVar2 = (gb->snd_1).sweep_time;
      (gb->snd_1).sweep_count = UVar2;
      (gb->snd_1).sweep_neg_mode_used = false;
      (gb->snd_1).signal = '\0';
      if (gb->LegacyMode != '\0') {
        (gb->snd_1).length = (gb->snd_1).reg[1] & 0x3f;
      }
      (gb->snd_1).length_counting = true;
      uVar8 = CONCAT11(data,bVar7) & 0x7ff;
      (gb->snd_1).frequency = uVar8;
      (gb->snd_1).frequency_counter = uVar8;
      (gb->snd_1).cycles_left = 0;
      (gb->snd_1).duty_count = 0;
      bVar5 = (gb->snd_1).sweep_shift;
      (gb->snd_1).sweep_enabled = UVar2 != '\0' || bVar5 != 0;
      if ((gb->snd_1).channel == '\x03') {
        bVar10 = (gb->snd_1).reg[0] & 0x80;
      }
      else {
        bVar10 = bVar10 & 0xf8;
      }
      if (bVar10 == 0) {
        (gb->snd_1).on = false;
      }
      if ((bVar5 != 0) &&
         (uVar8 = CONCAT11(data,bVar7) & 0x7ff, iVar11 = (gb->snd_1).sweep_direction,
         (gb->snd_1).sweep_neg_mode_used = SUB41((uint)iVar11 >> 0x1f,0),
         0x7ff < (int)((uint)(uVar8 >> (bVar5 & 0x1f)) * iVar11 + (uint)uVar8))) {
        (gb->snd_1).on = false;
      }
      if ((gb->snd_1).length != '\0') {
        return;
      }
      if ((bVar4 & 1) == 0) {
        return;
      }
      if (((gb->snd_control).cycles & 0x2000) != 0) {
        return;
      }
      if ((bVar4 & 1) == 0) {
        return;
      }
      bVar10 = (gb->snd_1).length_mask & 1;
      (gb->snd_1).length = bVar10;
      if (bVar10 != 0) {
        return;
      }
      (gb->snd_1).on = false;
      (gb->snd_1).length_counting = false;
      return;
    }
    if ((gb->snd_1).sweep_enabled != false) {
      return;
    }
    uVar6 = (ushort)(data & 7) << 8;
LAB_0015a0c0:
    (gb->snd_1).frequency = uVar8 | uVar6;
    break;
  case '\x06':
    (gb->snd_2).reg[1] = data;
    if (UVar2 != '\0') {
      (gb->snd_2).duty = data >> 6;
    }
    (gb->snd_2).length = data & 0x3f;
    (gb->snd_2).length_counting = true;
    break;
  case '\a':
    (gb->snd_2).reg[2] = data;
    (gb->snd_2).envelope_value = data >> 4;
    (gb->snd_2).envelope_direction = -((data & 8) == 0) | 1;
    (gb->snd_2).envelope_time = data & 7;
    if ((gb->snd_2).channel == '\x03') {
      bVar10 = (gb->snd_2).reg[0] & 0x80;
    }
    else {
      bVar10 = data & 0xf8;
    }
    if (bVar10 == 0) {
      (gb->snd_2).on = false;
    }
    break;
  case '\b':
    (gb->snd_2).reg[3] = data;
    uVar6 = ((gb->snd_2).reg[4] & 7) << 8;
    uVar8 = (ushort)data;
    goto LAB_0015a139;
  case '\t':
    (gb->snd_2).reg[4] = data;
    bVar10 = data & 0x40;
    _Var3 = (gb->snd_2).length_enabled;
    (gb->snd_2).length_enabled = (_Bool)(bVar10 >> 6);
    if ((((_Var3 == false) && (((gb->snd_control).cycles & 0x2000) == 0)) && (bVar10 != 0)) &&
       (((gb->snd_2).length_counting != false &&
        (bVar7 = (gb->snd_2).length + 1 & (gb->snd_2).length_mask, (gb->snd_2).length = bVar7,
        bVar7 == 0)))) {
      (gb->snd_2).on = false;
      (gb->snd_2).length_counting = false;
    }
    if ((char)data < '\0') {
      (gb->snd_2).on = true;
      (gb->snd_2).envelope_enabled = true;
      bVar7 = (gb->snd_2).reg[2];
      (gb->snd_2).envelope_value = bVar7 >> 4;
      (gb->snd_2).envelope_count = (gb->snd_2).envelope_time;
      uVar8 = CONCAT11(data,(gb->snd_2).reg[3]) & 0x7ff;
      (gb->snd_2).frequency = uVar8;
      (gb->snd_2).frequency_counter = uVar8;
      (gb->snd_2).cycles_left = 0;
      (gb->snd_2).duty_count = 0;
      (gb->snd_2).signal = '\0';
      if (gb->LegacyMode != '\0') {
        (gb->snd_2).length = (gb->snd_2).reg[1] & 0x3f;
      }
      (gb->snd_2).length_counting = true;
      if ((gb->snd_2).channel == '\x03') {
        bVar7 = (gb->snd_2).reg[0] & 0x80;
      }
      else {
        bVar7 = bVar7 & 0xf8;
      }
      if (bVar7 == 0) {
        (gb->snd_2).on = false;
      }
      if ((gb->snd_2).length != '\0') {
        return;
      }
      if (bVar10 == 0) {
        return;
      }
      if (((gb->snd_control).cycles & 0x2000) != 0) {
        return;
      }
      bVar10 = (gb->snd_2).length_mask & 1;
      (gb->snd_2).length = bVar10;
      if (bVar10 != 0) {
        return;
      }
      (gb->snd_2).on = false;
      (gb->snd_2).length_counting = false;
      return;
    }
    uVar6 = (ushort)(data & 7) << 8;
    uVar8 = (ushort)(gb->snd_2).reg[3];
LAB_0015a139:
    (gb->snd_2).frequency = uVar8 | uVar6;
    break;
  case '\n':
    (gb->snd_3).reg[0] = data;
    if ((gb->snd_3).channel == '\x03') {
      bVar10 = data & 0x80;
    }
    else {
      bVar10 = (gb->snd_3).reg[2] & 0xf8;
    }
    if (bVar10 == 0) {
      (gb->snd_3).on = false;
    }
    else if (gb->LegacyMode != '\0') {
      (gb->snd_3).on = true;
    }
    break;
  case '\v':
    (gb->snd_3).reg[1] = data;
    (gb->snd_3).length = data;
    (gb->snd_3).length_counting = true;
    break;
  case '\f':
    (gb->snd_3).reg[2] = data;
    (gb->snd_3).level = data >> 5 & 3;
    break;
  case '\r':
    (gb->snd_3).reg[3] = data;
    uVar8 = (gb->snd_3).reg[4] & 7;
    uVar6 = (ushort)data;
    goto LAB_00159e5f;
  case '\x0e':
    (gb->snd_3).reg[4] = data;
    _Var3 = (gb->snd_3).length_enabled;
    (gb->snd_3).length_enabled = (_Bool)((data & 0x40) >> 6);
    if ((((_Var3 == false) && (((gb->snd_control).cycles & 0x2000) == 0)) && ((data & 0x40) != 0))
       && (((gb->snd_3).length_counting != false &&
           (bVar10 = (gb->snd_3).length + 1 & (gb->snd_3).length_mask, (gb->snd_3).length = bVar10,
           bVar10 == 0)))) {
      (gb->snd_3).on = false;
      (gb->snd_3).length_counting = false;
    }
    if ((char)data < '\0') {
      if (((gb->snd_3).on == true) && ((gb->snd_3).frequency_counter == 0x7ff)) {
        gb_corrupt_wave_ram(gb);
      }
      (gb->snd_3).on = true;
      (gb->snd_3).offset = '\0';
      (gb->snd_3).duty = '\x01';
      (gb->snd_3).duty_count = 0;
      if (gb->LegacyMode != '\0') {
        (gb->snd_3).length = (gb->snd_3).reg[1];
      }
      (gb->snd_3).length_counting = true;
      uVar8 = (ushort)(gb->snd_3).reg[3] | ((gb->snd_3).reg[4] & 7) << 8;
      (gb->snd_3).frequency = uVar8;
      (gb->snd_3).frequency_counter = uVar8;
      (gb->snd_3).cycles_left = -6;
      (gb->snd_3).sample_reading = false;
      if ((gb->snd_3).channel == '\x03') {
        bVar10 = (gb->snd_3).reg[0] & 0x80;
      }
      else {
        bVar10 = (gb->snd_3).reg[2] & 0xf8;
      }
      if (bVar10 == 0) {
        (gb->snd_3).on = false;
      }
      if ((gb->snd_3).length != '\0') {
        return;
      }
      if ((gb->snd_3).length_enabled != true) {
        return;
      }
      if (((gb->snd_control).cycles & 0x2000) != 0) {
        return;
      }
      bVar10 = (gb->snd_3).length_mask & 1;
      (gb->snd_3).length = bVar10;
      if (bVar10 != 0) {
        return;
      }
      (gb->snd_3).on = false;
      (gb->snd_3).length_counting = false;
      return;
    }
    uVar8 = (ushort)(data & 7);
    uVar6 = (ushort)(gb->snd_3).reg[3];
LAB_00159e5f:
    (gb->snd_3).frequency = uVar6 | uVar8 << 8;
    break;
  case '\x10':
    (gb->snd_4).reg[1] = data;
    (gb->snd_4).length = data & 0x3f;
    (gb->snd_4).length_counting = true;
    break;
  case '\x11':
    (gb->snd_4).reg[2] = data;
    (gb->snd_4).envelope_value = data >> 4;
    (gb->snd_4).envelope_direction = -((data & 8) == 0) | 1;
    (gb->snd_4).envelope_time = data & 7;
    if ((gb->snd_4).channel == '\x03') {
      bVar10 = (gb->snd_4).reg[0] & 0x80;
    }
    else {
      bVar10 = data & 0xf8;
    }
    if (bVar10 == 0) {
      (gb->snd_4).on = false;
    }
    break;
  case '\x12':
    (gb->snd_4).reg[3] = data;
    (gb->snd_4).noise_short = (_Bool)(data >> 3 & 1);
    break;
  case '\x13':
    (gb->snd_4).reg[4] = data;
    bVar10 = data & 0x40;
    _Var3 = (gb->snd_4).length_enabled;
    (gb->snd_4).length_enabled = (_Bool)(bVar10 >> 6);
    if ((((_Var3 == false) && (((gb->snd_control).cycles & 0x2000) == 0)) && (bVar10 != 0)) &&
       (((gb->snd_4).length_counting != false &&
        (bVar7 = (gb->snd_4).length + 1 & (gb->snd_4).length_mask, (gb->snd_4).length = bVar7,
        bVar7 == 0)))) {
      (gb->snd_4).on = false;
      (gb->snd_4).length_counting = false;
    }
    if ((char)data < '\0') {
      (gb->snd_4).on = true;
      (gb->snd_4).envelope_enabled = true;
      bVar7 = (gb->snd_4).reg[2];
      (gb->snd_4).envelope_value = bVar7 >> 4;
      (gb->snd_4).envelope_count = (gb->snd_4).envelope_time;
      (gb->snd_4).frequency_counter = 0;
      bVar4 = (gb->snd_4).reg[3];
      (gb->snd_4).cycles_left =
           *(int *)(gb_noise_period_cycles_divisor + (ulong)(bVar4 & 7) * 4) << (bVar4 >> 4);
      (gb->snd_4).signal = -1;
      (gb->snd_4).noise_lfsr = 0x7fff;
      if (gb->LegacyMode != '\0') {
        (gb->snd_4).length = (gb->snd_4).reg[1] & 0x3f;
      }
      (gb->snd_4).length_counting = true;
      if ((gb->snd_4).channel == '\x03') {
        bVar7 = (gb->snd_4).reg[0] & 0x80;
      }
      else {
        bVar7 = bVar7 & 0xf8;
      }
      if (bVar7 == 0) {
        (gb->snd_4).on = false;
      }
      if ((((gb->snd_4).length == '\0') && (bVar10 != 0)) &&
         ((((gb->snd_control).cycles & 0x2000) == 0 &&
          (bVar10 = (gb->snd_4).length_mask & 1, (gb->snd_4).length = bVar10, bVar10 == 0)))) {
        (gb->snd_4).on = false;
        (gb->snd_4).length_counting = false;
      }
    }
    break;
  case '\x14':
    (gb->snd_control).vol_left = data & 7;
    (gb->snd_control).vol_right = data >> 4 & 7;
    break;
  case '\x15':
    (gb->snd_control).mode1_right = data & 1;
    (gb->snd_control).mode1_left = data >> 4 & 1;
    (gb->snd_control).mode2_right = data >> 1 & 1;
    (gb->snd_control).mode2_left = data >> 5 & 1;
    (gb->snd_control).mode3_right = data >> 2 & 1;
    (gb->snd_control).mode3_left = data >> 6 & 1;
    (gb->snd_control).mode4_right = data >> 3 & 1;
    (gb->snd_control).mode4_left = data >> 7;
    break;
  case '\x16':
    bVar10 = data & 0x80;
    if (bVar10 == 0) {
      if (gb->gbMode == '\x01') {
        bVar7 = gb->snd_regs[0];
        if (UVar2 != '\0') {
          gb->snd_regs[0] = '\0';
        }
        (gb->snd_1).reg[0] = '\0';
        (gb->snd_1).sweep_shift = '\0';
        (gb->snd_1).sweep_direction = 1;
        (gb->snd_1).sweep_time = '\0';
        if (((bVar7 & 8) != 0) && ((gb->snd_1).sweep_neg_mode_used == true)) {
          (gb->snd_1).on = false;
        }
        (gb->snd_1).duty = '\0';
        if (UVar2 == '\0') {
          (gb->snd_1).reg[1] = '\0';
        }
        else {
          gb->snd_regs[1] = '\0';
          (gb->snd_1).reg[1] = '\0';
          (gb->snd_1).duty = '\0';
        }
        (gb->snd_1).length = '\0';
        (gb->snd_1).length_counting = true;
        gb_sound_w_internal(gb,'\x02','\0');
        if ((gb->snd_control).on != '\0') {
          gb->snd_regs[3] = '\0';
        }
        (gb->snd_1).reg[3] = '\0';
        if ((gb->snd_1).sweep_enabled == false) {
          (gb->snd_1).frequency = ((gb->snd_1).reg[4] & 7) << 8;
        }
        gb_sound_w_internal(gb,'\x04','\0');
        (gb->snd_1).length_counting = false;
        (gb->snd_1).sweep_neg_mode_used = false;
        if ((gb->snd_control).on == '\0') {
          (gb->snd_2).reg[1] = '\0';
        }
        else {
          gb->snd_regs[6] = '\0';
          (gb->snd_2).reg[1] = '\0';
          (gb->snd_2).duty = '\0';
        }
        (gb->snd_2).length = '\0';
        (gb->snd_2).length_counting = true;
        gb_sound_w_internal(gb,'\a','\0');
        UVar2 = (gb->snd_control).on;
        if (UVar2 != '\0') {
          gb->snd_regs[8] = '\0';
        }
        bVar7 = (gb->snd_2).reg[4];
        (gb->snd_2).reg[3] = '\0';
        (gb->snd_2).frequency = (bVar7 & 7) << 8;
        if (UVar2 != '\0') {
          gb->snd_regs[9] = '\0';
        }
        (gb->snd_2).reg[4] = '\0';
        (gb->snd_2).frequency = 0;
        (gb->snd_2).length_counting = false;
        (gb->snd_2).length_enabled = false;
        gb_sound_w_internal(gb,'\n','\0');
        UVar2 = (gb->snd_control).on;
        if (UVar2 != '\0') {
          gb->snd_regs[0xb] = '\0';
        }
        (gb->snd_3).reg[1] = '\0';
        (gb->snd_3).length = '\0';
        (gb->snd_3).length_counting = true;
        if (UVar2 != '\0') {
          gb->snd_regs[0xc] = '\0';
          gb->snd_regs[0xd] = '\0';
        }
        (gb->snd_3).reg[2] = '\0';
        (gb->snd_3).level = '\0';
        bVar7 = (gb->snd_3).reg[4];
        (gb->snd_3).reg[3] = '\0';
        (gb->snd_3).frequency = (bVar7 & 7) << 8;
        if (UVar2 == '\0') {
          (gb->snd_3).reg[4] = '\0';
          (gb->snd_3).frequency = 0;
          (gb->snd_3).length_counting = false;
          (gb->snd_3).length_enabled = false;
          (gb->snd_3).current_sample = '\0';
        }
        else {
          gb->snd_regs[0xe] = '\0';
          (gb->snd_3).reg[4] = '\0';
          (gb->snd_3).frequency = 0;
          (gb->snd_3).length_counting = false;
          (gb->snd_3).length_enabled = false;
          (gb->snd_3).current_sample = '\0';
          gb->snd_regs[0x10] = '\0';
        }
        (gb->snd_4).reg[1] = '\0';
        (gb->snd_4).length = '\0';
        (gb->snd_4).length_counting = true;
LAB_0015a903:
        gb_sound_w_internal(gb,'\x11','\0');
        if ((gb->snd_control).on != '\0') {
          gb->snd_regs[0x12] = '\0';
          gb->snd_regs[0x13] = '\0';
        }
        (gb->snd_4).reg[3] = '\0';
        (gb->snd_4).noise_short = false;
        (gb->snd_4).reg[4] = '\0';
        (gb->snd_4).length_enabled = false;
        (gb->snd_4).length_counting = false;
        (gb->snd_4).cycles_left = 8;
      }
      else if (gb->gbMode == '\0') {
        bVar7 = gb->snd_regs[0];
        if (UVar2 != '\0') {
          gb->snd_regs[0] = '\0';
        }
        (gb->snd_1).reg[0] = '\0';
        (gb->snd_1).sweep_shift = '\0';
        (gb->snd_1).sweep_direction = 1;
        (gb->snd_1).sweep_time = '\0';
        if (((bVar7 & 8) != 0) && ((gb->snd_1).sweep_neg_mode_used == true)) {
          (gb->snd_1).on = false;
        }
        (gb->snd_1).duty = '\0';
        gb->snd_regs[1] = '\0';
        gb_sound_w_internal(gb,'\x02','\0');
        if ((gb->snd_control).on != '\0') {
          gb->snd_regs[3] = '\0';
        }
        (gb->snd_1).reg[3] = '\0';
        if ((gb->snd_1).sweep_enabled == false) {
          (gb->snd_1).frequency = ((gb->snd_1).reg[4] & 7) << 8;
        }
        gb_sound_w_internal(gb,'\x04','\0');
        (gb->snd_1).length_counting = false;
        (gb->snd_1).sweep_neg_mode_used = false;
        gb->snd_regs[6] = '\0';
        gb_sound_w_internal(gb,'\a','\0');
        UVar2 = (gb->snd_control).on;
        if (UVar2 != '\0') {
          gb->snd_regs[8] = '\0';
        }
        bVar7 = (gb->snd_2).reg[4];
        (gb->snd_2).reg[3] = '\0';
        (gb->snd_2).frequency = (bVar7 & 7) << 8;
        if (UVar2 != '\0') {
          gb->snd_regs[9] = '\0';
        }
        (gb->snd_2).reg[4] = '\0';
        (gb->snd_2).frequency = 0;
        (gb->snd_2).length_counting = false;
        (gb->snd_2).length_enabled = false;
        gb_sound_w_internal(gb,'\n','\0');
        UVar2 = (gb->snd_control).on;
        if (UVar2 != '\0') {
          gb->snd_regs[0xc] = '\0';
          gb->snd_regs[0xd] = '\0';
        }
        (gb->snd_3).reg[2] = '\0';
        (gb->snd_3).level = '\0';
        bVar7 = (gb->snd_3).reg[4];
        (gb->snd_3).reg[3] = '\0';
        (gb->snd_3).frequency = (bVar7 & 7) << 8;
        if (UVar2 != '\0') {
          gb->snd_regs[0xe] = '\0';
        }
        (gb->snd_3).reg[4] = '\0';
        (gb->snd_3).frequency = 0;
        (gb->snd_3).length_counting = false;
        (gb->snd_3).length_enabled = false;
        (gb->snd_3).current_sample = '\0';
        gb->snd_regs[0x10] = '\0';
        goto LAB_0015a903;
      }
      (gb->snd_1).on = false;
      (gb->snd_2).on = false;
      (gb->snd_3).on = false;
      (gb->snd_4).on = false;
      (gb->snd_control).wave_ram_locked = false;
      iVar11 = -2;
      do {
        gb_sound_w_internal(gb,(char)iVar11 + '\x16','\0');
        iVar11 = iVar11 + 1;
      } while (iVar11 != 0);
    }
    else if (UVar2 == '\0') {
      pbVar1 = (byte *)((long)&(gb->snd_control).cycles + 1);
      *pbVar1 = *pbVar1 | 0xe0;
    }
    (gb->snd_control).on = bVar10 != 0;
    gb->snd_regs[0x16] = bVar10;
  }
  return;
}

Assistant:

static void gb_sound_w_internal(gb_sound_t *gb, UINT8 offset, UINT8 data)
{
	/* Store the value */
	UINT8 old_data = gb->snd_regs[offset];

	if (gb->snd_control.on)
	{
		gb->snd_regs[offset] = data;
	}

	switch (offset)
	{
	/*MODE 1 */
	case NR10: /* Sweep (R/W) */
		gb->snd_1.reg[0] = data;
		gb->snd_1.sweep_shift = data & 0x7;
		gb->snd_1.sweep_direction = (data & 0x8) ? -1 : 1;
		gb->snd_1.sweep_time = (data & 0x70) >> 4;
		if ((old_data & 0x08) && !(data & 0x08) && gb->snd_1.sweep_neg_mode_used)
		{
			gb->snd_1.on = false;
		}
		break;
	case NR11: /* Sound length/Wave pattern duty (R/W) */
		gb->snd_1.reg[1] = data;
		if (gb->snd_control.on)
		{
			gb->snd_1.duty = (data & 0xc0) >> 6;
		}
		gb->snd_1.length = data & 0x3f;
		gb->snd_1.length_counting = true;
		break;
	case NR12: /* Envelope (R/W) */
		gb->snd_1.reg[2] = data;
		gb->snd_1.envelope_value = data >> 4;
		gb->snd_1.envelope_direction = (data & 0x8) ? 1 : -1;
		gb->snd_1.envelope_time = data & 0x07;
		if (!gb_dac_enabled(&gb->snd_1))
		{
			gb->snd_1.on = false;
		}
		break;
	case NR13: /* Frequency lo (R/W) */
		gb->snd_1.reg[3] = data;
		// Only enabling the frequency line breaks blarggs's sound test #5
		// This condition may not be correct
		if (!gb->snd_1.sweep_enabled)
		{
			gb->snd_1.frequency = ((gb->snd_1.reg[4] & 0x7) << 8) | gb->snd_1.reg[3];
		}
		break;
	case NR14: /* Frequency hi / Initialize (R/W) */
		gb->snd_1.reg[4] = data;
		{
			bool length_was_enabled = gb->snd_1.length_enabled;

			gb->snd_1.length_enabled = (data & 0x40) ? true : false;
			gb->snd_1.frequency = ((gb->snd_regs[NR14] & 0x7) << 8) | gb->snd_1.reg[3];

			if (!length_was_enabled && !(gb->snd_control.cycles & FRAME_CYCLES) && gb->snd_1.length_counting)
			{
				if (gb->snd_1.length_enabled)
				{
					gb_tick_length(&gb->snd_1);
				}
			}

			if (data & 0x80)
			{
				gb->snd_1.on = true;
				gb->snd_1.envelope_enabled = true;
				gb->snd_1.envelope_value = gb->snd_1.reg[2] >> 4;
				gb->snd_1.envelope_count = gb->snd_1.envelope_time;
				gb->snd_1.sweep_count = gb->snd_1.sweep_time;
				gb->snd_1.sweep_neg_mode_used = false;
				gb->snd_1.signal = 0;
				if (gb->LegacyMode)
					gb->snd_1.length = gb->snd_1.reg[1] & 0x3f;	// VGM log fix -Valley Bell
				gb->snd_1.length_counting = true;
				gb->snd_1.frequency = ((gb->snd_1.reg[4] & 0x7) << 8) | gb->snd_1.reg[3];
				gb->snd_1.frequency_counter = gb->snd_1.frequency;
				gb->snd_1.cycles_left = 0;
				gb->snd_1.duty_count = 0;
				gb->snd_1.sweep_enabled = (gb->snd_1.sweep_shift != 0) || (gb->snd_1.sweep_time != 0);
				if (!gb_dac_enabled(&gb->snd_1))
				{
					gb->snd_1.on = false;
				}
				if (gb->snd_1.sweep_shift > 0)
				{
					gb_calculate_next_sweep(&gb->snd_1);
				}

				if (gb->snd_1.length == 0 && gb->snd_1.length_enabled && !(gb->snd_control.cycles & FRAME_CYCLES))
				{
					gb_tick_length(&gb->snd_1);
				}
			}
			else
			{
				// This condition may not be correct
				if (!gb->snd_1.sweep_enabled)
				{
					gb->snd_1.frequency = ((gb->snd_1.reg[4] & 0x7) << 8) | gb->snd_1.reg[3];
				}
			}
		}
		break;

	/*MODE 2 */
	case NR21: /* Sound length/Wave pattern duty (R/W) */
		gb->snd_2.reg[1] = data;
		if (gb->snd_control.on)
		{
			gb->snd_2.duty = (data & 0xc0) >> 6;
		}
		gb->snd_2.length = data & 0x3f;
		gb->snd_2.length_counting = true;
		break;
	case NR22: /* Envelope (R/W) */
		gb->snd_2.reg[2] = data;
		gb->snd_2.envelope_value = data >> 4;
		gb->snd_2.envelope_direction = (data & 0x8) ? 1 : -1;
		gb->snd_2.envelope_time = data & 0x07;
		if (!gb_dac_enabled(&gb->snd_2))
		{
			gb->snd_2.on = false;
		}
		break;
	case NR23: /* Frequency lo (R/W) */
		gb->snd_2.reg[3] = data;
		gb->snd_2.frequency = ((gb->snd_2.reg[4] & 0x7) << 8) | gb->snd_2.reg[3];
		break;
	case NR24: /* Frequency hi / Initialize (R/W) */
		gb->snd_2.reg[4] = data;
		{
			bool length_was_enabled = gb->snd_2.length_enabled;

			gb->snd_2.length_enabled = (data & 0x40) ? true : false;

			if (!length_was_enabled && !(gb->snd_control.cycles & FRAME_CYCLES) && gb->snd_2.length_counting)
			{
				if (gb->snd_2.length_enabled)
				{
					gb_tick_length(&gb->snd_2);
				}
			}

			if (data & 0x80)
			{
				gb->snd_2.on = true;
				gb->snd_2.envelope_enabled = true;
				gb->snd_2.envelope_value = gb->snd_2.reg[2] >> 4;
				gb->snd_2.envelope_count = gb->snd_2.envelope_time;
				gb->snd_2.frequency = ((gb->snd_2.reg[4] & 0x7) << 8) | gb->snd_2.reg[3];
				gb->snd_2.frequency_counter = gb->snd_2.frequency;
				gb->snd_2.cycles_left = 0;
				gb->snd_2.duty_count = 0;
				gb->snd_2.signal = 0;
				if (gb->LegacyMode)
					gb->snd_2.length = gb->snd_2.reg[1] & 0x3f;	// VGM log fix -Valley Bell
				gb->snd_2.length_counting = true;

				if (!gb_dac_enabled(&gb->snd_2))
				{
					gb->snd_2.on = false;
				}

				if (gb->snd_2.length == 0 && gb->snd_2.length_enabled && !(gb->snd_control.cycles & FRAME_CYCLES))
				{
					gb_tick_length(&gb->snd_2);
				}
			}
			else
			{
				gb->snd_2.frequency = ((gb->snd_2.reg[4] & 0x7) << 8) | gb->snd_2.reg[3];
			}
		}
		break;

	/*MODE 3 */
	case NR30: /* Sound On/Off (R/W) */
		gb->snd_3.reg[0] = data;
		if (!gb_dac_enabled(&gb->snd_3))
		{
			gb->snd_3.on = false;
		}
		else if (gb->LegacyMode)
			gb->snd_3.on = true;	// even more VGM log fix -Valley Bell
		break;
	case NR31: /* Sound Length (R/W) */
		gb->snd_3.reg[1] = data;
		gb->snd_3.length = data;
		gb->snd_3.length_counting = true;
		break;
	case NR32: /* Select Output Level */
		gb->snd_3.reg[2] = data;
		gb->snd_3.level = (data & 0x60) >> 5;
		break;
	case NR33: /* Frequency lo (W) */
		gb->snd_3.reg[3] = data;
		gb->snd_3.frequency = ((gb->snd_3.reg[4] & 0x7) << 8) | gb->snd_3.reg[3];
		break;
	case NR34: /* Frequency hi / Initialize (W) */
		gb->snd_3.reg[4] = data;
		{
			bool length_was_enabled = gb->snd_3.length_enabled;

			gb->snd_3.length_enabled = (data & 0x40) ? true : false;

			if (!length_was_enabled && !(gb->snd_control.cycles & FRAME_CYCLES) && gb->snd_3.length_counting)
			{
				if (gb->snd_3.length_enabled)
				{
					gb_tick_length(&gb->snd_3);
				}
			}

			if (data & 0x80)
			{
				if (gb->snd_3.on && gb->snd_3.frequency_counter == 0x7ff)
				{
					gb_corrupt_wave_ram(gb);
				}
				gb->snd_3.on = true;
				gb->snd_3.offset = 0;
				gb->snd_3.duty = 1;
				gb->snd_3.duty_count = 0;
				if (gb->LegacyMode)
					gb->snd_3.length = gb->snd_3.reg[1];	// VGM log fix -Valley Bell
				gb->snd_3.length_counting = true;
				gb->snd_3.frequency = ((gb->snd_3.reg[4] & 0x7) << 8) | gb->snd_3.reg[3];
				gb->snd_3.frequency_counter = gb->snd_3.frequency;
				// There is a tiny bit of delay in starting up the wave channel
				gb->snd_3.cycles_left = -6;
				gb->snd_3.sample_reading = false;

				if (!gb_dac_enabled(&gb->snd_3))
				{
					gb->snd_3.on = false;
				}

				if (gb->snd_3.length == 0 && gb->snd_3.length_enabled && !(gb->snd_control.cycles & FRAME_CYCLES))
				{
					gb_tick_length(&gb->snd_3);
				}
			}
			else
			{
				gb->snd_3.frequency = ((gb->snd_3.reg[4] & 0x7) << 8) | gb->snd_3.reg[3];
			}
		}
		break;

	/*MODE 4 */
	case NR41: /* Sound Length (R/W) */
		gb->snd_4.reg[1] = data;
		gb->snd_4.length = data & 0x3f;
		gb->snd_4.length_counting = true;
		break;
	case NR42: /* Envelope (R/W) */
		gb->snd_4.reg[2] = data;
		gb->snd_4.envelope_value = data >> 4;
		gb->snd_4.envelope_direction = (data & 0x8) ? 1 : -1;
		gb->snd_4.envelope_time = data & 0x07;
		if (!gb_dac_enabled(&gb->snd_4))
		{
			gb->snd_4.on = false;
		}
		break;
	case NR43: /* Polynomial Counter/Frequency */
		gb->snd_4.reg[3] = data;
		gb->snd_4.noise_short = (data & 0x8);
		break;
	case NR44: /* Counter/Consecutive / Initialize (R/W)  */
		gb->snd_4.reg[4] = data;
		{
			bool length_was_enabled = gb->snd_4.length_enabled;

			gb->snd_4.length_enabled = (data & 0x40) ? true : false;

			if (!length_was_enabled && !(gb->snd_control.cycles & FRAME_CYCLES) && gb->snd_4.length_counting)
			{
				if (gb->snd_4.length_enabled)
				{
					gb_tick_length(&gb->snd_4);
				}
			}

			if (data & 0x80)
			{
				gb->snd_4.on = true;
				gb->snd_4.envelope_enabled = true;
				gb->snd_4.envelope_value = gb->snd_4.reg[2] >> 4;
				gb->snd_4.envelope_count = gb->snd_4.envelope_time;
				gb->snd_4.frequency_counter = 0;
				gb->snd_4.cycles_left = gb_noise_period_cycles(gb);
				gb->snd_4.signal = -1;
				gb->snd_4.noise_lfsr = 0x7fff;
				if (gb->LegacyMode)
					gb->snd_4.length = gb->snd_4.reg[1] & 0x3f;	// VGM log fix -Valley Bell
				gb->snd_4.length_counting = true;

				if (!gb_dac_enabled(&gb->snd_4))
				{
					gb->snd_4.on = false;
				}

				if (gb->snd_4.length == 0 && gb->snd_4.length_enabled && !(gb->snd_control.cycles & FRAME_CYCLES))
				{
					gb_tick_length(&gb->snd_4);
				}
			}
		}
		break;

	/* CONTROL */
	case NR50: /* Channel Control / On/Off / Volume (R/W)  */
		gb->snd_control.vol_left = data & 0x7;
		gb->snd_control.vol_right = (data & 0x70) >> 4;
		break;
	case NR51: /* Selection of Sound Output Terminal */
		gb->snd_control.mode1_right = data & 0x1;
		gb->snd_control.mode1_left = (data & 0x10) >> 4;
		gb->snd_control.mode2_right = (data & 0x2) >> 1;
		gb->snd_control.mode2_left = (data & 0x20) >> 5;
		gb->snd_control.mode3_right = (data & 0x4) >> 2;
		gb->snd_control.mode3_left = (data & 0x40) >> 6;
		gb->snd_control.mode4_right = (data & 0x8) >> 3;
		gb->snd_control.mode4_left = (data & 0x80) >> 7;
		break;
	case NR52: // Sound On/Off (R/W)
		// Only bit 7 is writable, writing to bits 0-3 does NOT enable or disable sound. They are read-only.
		if (!(data & 0x80))
		{
			// On DMG the length counters are not affected and not clocked
			// powering off should actually clear all registers
			gb_apu_power_off(gb);
		}
		else
		{
			if (!gb->snd_control.on)
			{
				// When switching on, the next step should be 0.
				gb->snd_control.cycles |= 7 * FRAME_CYCLES;
			}
		}
		gb->snd_control.on = (data & 0x80) ? true : false;
		gb->snd_regs[NR52] = data & 0x80;
		break;
	}
}